

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O0

void __thiscall
oqpi::scheduler<concurrent_queue>::signalAvailableWorker
          (scheduler<concurrent_queue> *this,worker_base *w)

{
  bool bVar1;
  int local_2c;
  undefined1 local_28 [8];
  task_handle hTask;
  worker_base *w_local;
  scheduler<concurrent_queue> *this_local;
  
  hTask.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)w;
  do {
    waitForNextTask((scheduler<concurrent_queue> *)local_28,(worker_base *)this);
    bVar1 = std::atomic<bool>::load(&this->running_,memory_order_seq_cst);
    if (bVar1) {
      bVar1 = task_handle::isValid((task_handle *)local_28);
      if ((((!bVar1) || (bVar1 = task_handle::isGrabbed((task_handle *)local_28), !bVar1)) &&
          (bVar1 = assert_and_return_false
                             ("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/scheduler.hpp"
                              ,0x129,"hTask.isValid() && hTask.isGrabbed()",""), !bVar1)) ||
         (bVar1 = task_handle::isDone((task_handle *)local_28), bVar1)) {
        local_2c = 0;
      }
      else {
        worker_base::assign((worker_base *)
                            hTask.spTask_.
                            super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,(task_handle *)local_28);
        local_2c = 3;
      }
    }
    else {
      local_2c = 1;
    }
    task_handle::~task_handle((task_handle *)local_28);
  } while (local_2c == 0);
  return;
}

Assistant:

void signalAvailableWorker(worker_base &w)
        {
            // Loop until we find a task to work on
            while (true)
            {
                // Grab the next task
                task_handle hTask = waitForNextTask(w);

                // We could have been waken up to stop
                if (!running_.load())
                {
                    return;
                }

                // Make sure it's runnable
                if (oqpi_ensure(hTask.isValid() && hTask.isGrabbed()))
                {
                    // Make sure it's not done (activeWait on groups can leave a task done without being grabbed)
                    if (!hTask.isDone())
                    {
                        // Assign it to the available worker
                        w.assign(std::move(hTask));

                        // We got a task! See ya!
                        break;
                    }
                }
            }
        }